

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

void __thiscall
capnp::compiler::CompilerMain::writeConversion
          (CompilerMain *this,Reader reader,OutputStream *output)

{
  word *pwVar1;
  uint uVar2;
  Reader *pRVar3;
  uint *puVar4;
  size_t sVar5;
  uint uVar6;
  MallocMessageBuilder *this_00;
  ArrayPtr<capnp::word> uncheckedBuffer;
  ArrayPtr<capnp::word> uncheckedBuffer_00;
  MessageSizeCounts MVar7;
  PackedOutputStream packed;
  Array<capnp::word> words_2;
  MallocMessageBuilder message;
  
  if (JSON < this->convertTo) {
    kj::_::unreachable();
  }
  puVar4 = &switchD_001200f0::switchdataD_001e2590;
  switch(this->convertTo) {
  case BINARY:
    uVar2 = this->segmentSize;
    uVar6 = 0x400;
    if (uVar2 != 0) {
      uVar6 = uVar2;
    }
    MallocMessageBuilder::MallocMessageBuilder(&message,uVar6,uVar2 == 0);
    MessageBuilder::setRoot<capnp::AnyStruct::Reader&>
              (&message.super_MessageBuilder,(Reader *)&reader._reader);
    writeMessage(output,&message.super_MessageBuilder);
    goto LAB_001202aa;
  case PACKED:
    uVar2 = this->segmentSize;
    uVar6 = 0x400;
    if (uVar2 != 0) {
      uVar6 = uVar2;
    }
    MallocMessageBuilder::MallocMessageBuilder(&message,uVar6,uVar2 == 0);
    MessageBuilder::setRoot<capnp::AnyStruct::Reader&>
              (&message.super_MessageBuilder,(Reader *)&reader._reader);
    writePackedMessage(output,&message.super_MessageBuilder);
LAB_001202aa:
    MallocMessageBuilder::~MallocMessageBuilder(&message);
    return;
  case FLAT:
    MVar7 = capnp::_::StructReader::totalSize(&reader._reader);
    pwVar1 = (word *)(MVar7.wordCount + 1);
    pRVar3 = (Reader *)kj::_::HeapArrayDisposer::allocate<capnp::word>((size_t)pwVar1);
    message.super_MessageBuilder.arenaSpace[1] = &kj::_::HeapArrayDisposer::instance;
    sVar5 = MVar7.wordCount * 8 + 8;
    message.super_MessageBuilder._vptr_MessageBuilder = (_func_int **)pRVar3;
    message.super_MessageBuilder.arenaSpace[0] = pwVar1;
    memset(pRVar3,0,sVar5);
    uncheckedBuffer.size_ = (size_t)puVar4;
    uncheckedBuffer.ptr = pwVar1;
    copyToUnchecked<capnp::AnyStruct::Reader&>((capnp *)&reader._reader,pRVar3,uncheckedBuffer);
    (*output->_vptr_OutputStream[2])(output,pRVar3,sVar5);
    break;
  case FLAT_PACKED:
    MVar7 = capnp::_::StructReader::totalSize(&reader._reader);
    pwVar1 = (word *)(MVar7.wordCount + 1);
    pRVar3 = (Reader *)kj::_::HeapArrayDisposer::allocate<capnp::word>((size_t)pwVar1);
    words_2.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    words_2.ptr = (word *)pRVar3;
    words_2.size_ = (size_t)pwVar1;
    memset(pRVar3,0,MVar7.wordCount * 8 + 8);
    uncheckedBuffer_00.size_ = (size_t)puVar4;
    uncheckedBuffer_00.ptr = pwVar1;
    copyToUnchecked<capnp::AnyStruct::Reader&>((capnp *)&reader._reader,pRVar3,uncheckedBuffer_00);
    sVar5 = 0;
    kj::BufferedOutputStreamWrapper::BufferedOutputStreamWrapper
              ((BufferedOutputStreamWrapper *)&message,output,(ArrayPtr<unsigned_char>)ZEXT816(0));
    capnp::_::PackedOutputStream::PackedOutputStream(&packed,(BufferedOutputStream *)&message);
    capnp::_::PackedOutputStream::write(&packed,(int)words_2.ptr,(void *)(words_2.size_ << 3),sVar5)
    ;
    capnp::_::PackedOutputStream::~PackedOutputStream(&packed);
    kj::BufferedOutputStreamWrapper::~BufferedOutputStreamWrapper
              ((BufferedOutputStreamWrapper *)&message);
    this_00 = (MallocMessageBuilder *)&words_2;
    goto LAB_00120265;
  case CANONICAL:
    capnp::_::StructReader::canonicalize((Array<capnp::word> *)&message,&reader._reader);
    (*output->_vptr_OutputStream[2])
              (output,message.super_MessageBuilder._vptr_MessageBuilder,
               (long)message.super_MessageBuilder.arenaSpace[0] << 3);
    break;
  case TEXT:
    TextCodec::TextCodec((TextCodec *)&packed);
    TextCodec::setPrettyPrint((TextCodec *)&packed,this->pretty);
    message.super_MessageBuilder._vptr_MessageBuilder =
         (_func_int **)(this->rootType).super_Schema.raw;
    message.super_MessageBuilder.arenaSpace[4] = (void *)reader._reader._32_8_;
    message.super_MessageBuilder.arenaSpace[5] = (void *)reader._reader._40_8_;
    message.super_MessageBuilder.arenaSpace[2] = reader._reader.data;
    message.super_MessageBuilder.arenaSpace[3] = reader._reader.pointers;
    message.super_MessageBuilder.arenaSpace[0] = reader._reader.segment;
    message.super_MessageBuilder.arenaSpace[1] = reader._reader.capTable;
    TextCodec::encode<capnp::DynamicStruct::Reader>
              ((String *)&words_2,(TextCodec *)&packed,(Reader *)&message);
    message.super_MessageBuilder.arenaSpace[0] = (void *)0x0;
    if (words_2.size_ != 0) {
      message.super_MessageBuilder.arenaSpace[0] = (void *)(words_2.size_ - 1);
    }
    message.super_MessageBuilder.arenaSpace[1] = &kj::_::ByteLiteral<2ul>;
    message.super_MessageBuilder.arenaSpace[2] = (void *)0x1;
    (*output->_vptr_OutputStream[3])(output,&message,2);
    kj::Array<char>::~Array((Array<char> *)&words_2);
    TextCodec::~TextCodec((TextCodec *)&packed);
    return;
  case JSON:
    JsonCodec::JsonCodec((JsonCodec *)&packed);
    JsonCodec::setPrettyPrint((JsonCodec *)&packed,this->pretty);
    JsonCodec::handleByAnnotation((JsonCodec *)&packed,(this->rootType).super_Schema.raw);
    message.super_MessageBuilder._vptr_MessageBuilder =
         (_func_int **)(this->rootType).super_Schema.raw;
    message.super_MessageBuilder.arenaSpace[4] = (void *)reader._reader._32_8_;
    message.super_MessageBuilder.arenaSpace[5] = (void *)reader._reader._40_8_;
    message.super_MessageBuilder.arenaSpace[2] = reader._reader.data;
    message.super_MessageBuilder.arenaSpace[3] = reader._reader.pointers;
    message.super_MessageBuilder.arenaSpace[0] = reader._reader.segment;
    message.super_MessageBuilder.arenaSpace[1] = reader._reader.capTable;
    JsonCodec::encode<capnp::DynamicStruct::Reader>
              ((String *)&words_2,(JsonCodec *)&packed,(Reader *)&message);
    message.super_MessageBuilder.arenaSpace[0] = (void *)0x0;
    if (words_2.size_ != 0) {
      message.super_MessageBuilder.arenaSpace[0] = (void *)(words_2.size_ - 1);
    }
    message.super_MessageBuilder.arenaSpace[1] = &kj::_::ByteLiteral<2ul>;
    message.super_MessageBuilder.arenaSpace[2] = (void *)0x1;
    (*output->_vptr_OutputStream[3])(output,&message,2);
    kj::Array<char>::~Array((Array<char> *)&words_2);
    JsonCodec::~JsonCodec((JsonCodec *)&packed);
    return;
  }
  this_00 = &message;
LAB_00120265:
  kj::Array<capnp::word>::~Array((Array<capnp::word> *)this_00);
  return;
}

Assistant:

void writeConversion(AnyStruct::Reader reader, kj::OutputStream& output) {
    switch (convertTo) {
      case Format::BINARY: {
        MallocMessageBuilder message(
            segmentSize == 0 ? SUGGESTED_FIRST_SEGMENT_WORDS : segmentSize,
            segmentSize == 0 ? SUGGESTED_ALLOCATION_STRATEGY : AllocationStrategy::FIXED_SIZE);
        message.setRoot(reader);
        capnp::writeMessage(output, message);
        return;
      }
      case Format::PACKED: {
        MallocMessageBuilder message(
            segmentSize == 0 ? SUGGESTED_FIRST_SEGMENT_WORDS : segmentSize,
            segmentSize == 0 ? SUGGESTED_ALLOCATION_STRATEGY : AllocationStrategy::FIXED_SIZE);
        message.setRoot(reader);
        capnp::writePackedMessage(output, message);
        return;
      }
      case Format::FLAT: {
        auto words = kj::heapArray<word>(reader.totalSize().wordCount + 1);
        memset(words.begin(), 0, words.asBytes().size());
        copyToUnchecked(reader, words);
        output.write(words.asBytes());
        return;
      }
      case Format::FLAT_PACKED: {
        auto words = kj::heapArray<word>(reader.totalSize().wordCount + 1);
        memset(words.begin(), 0, words.asBytes().size());
        copyToUnchecked(reader, words);
        kj::BufferedOutputStreamWrapper buffered(output);
        capnp::_::PackedOutputStream packed(buffered);
        packed.write(words.asBytes());
        return;
      }
      case Format::CANONICAL: {
        auto words = reader.canonicalize();
        output.write(words.asBytes());
        return;
      }
      case Format::TEXT: {
        TextCodec codec;
        codec.setPrettyPrint(pretty);
        auto text = codec.encode(reader.as<DynamicStruct>(rootType));
        output.write({text.asBytes(), "\n"_kjb});
        return;
      }
      case Format::JSON: {
        JsonCodec codec;
        codec.setPrettyPrint(pretty);
        codec.handleByAnnotation(rootType);
        auto text = codec.encode(reader.as<DynamicStruct>(rootType));
        output.write({text.asBytes(), "\n"_kjb});
        return;
      }
    }

    KJ_UNREACHABLE;
  }